

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O2

bool __thiscall mpt::buffer::move(buffer *this,buffer *from)

{
  bool bVar1;
  
  bVar1 = true;
  if (this != from) {
    if ((from->_used <= this->_size) && (bVar1 = trim(this,this->_used), bVar1)) {
      memcpy(this + 1,from + 1,from->_used);
      this->_used = from->_used;
      from->_used = 0;
      return true;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool buffer::move(buffer &from)
{
	if (this == &from) {
		return true;
	}
	if (_size < from._used) {
		return false;
	}
	if (!trim(_used)) {
		return false;
	}
	memcpy(static_cast<void *>(this + 1), static_cast<void *>((&from) + 1), from._used);
	_used = from._used;
	from._used = 0;
	return true;
}